

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O0

int Abc_NodeRemoveDupFanins_int(Abc_Obj_t *pNode)

{
  DdManager *dd_00;
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *n;
  DdNode *bTemp;
  DdNode *bTrans;
  DdNode *bVar2;
  DdNode *bVar1;
  DdManager *dd;
  int k;
  int i;
  Abc_Obj_t *pFanin2;
  Abc_Obj_t *pFanin1;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_NtkIsBddLogic(pNode->pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsBddLogic(pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                  ,0x93,"int Abc_NodeRemoveDupFanins_int(Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjIsNode(pNode);
  if (iVar1 != 0) {
    dd._4_4_ = 0;
    do {
      iVar1 = Abc_ObjFaninNum(pNode);
      if (iVar1 <= dd._4_4_) {
        return 0;
      }
      pAVar2 = Abc_ObjFanin(pNode,dd._4_4_);
      for (dd._0_4_ = 0;
          (iVar1 = Abc_ObjFaninNum(pNode), (int)dd < iVar1 &&
          (pAVar3 = Abc_ObjFanin(pNode,(int)dd), (int)dd < dd._4_4_)); dd._0_4_ = (int)dd + 1) {
        if (pAVar3 == pAVar2) {
          dd_00 = (DdManager *)pNode->pNtk->pManFunc;
          pDVar4 = Cudd_bddIthVar(dd_00,dd._4_4_);
          pDVar5 = Cudd_bddIthVar(dd_00,(int)dd);
          n = Cudd_bddXnor(dd_00,pDVar4,pDVar5);
          Cudd_Ref(n);
          pDVar4 = (DdNode *)(pNode->field_5).pData;
          pDVar5 = Cudd_bddAndAbstract(dd_00,pDVar4,n,pDVar5);
          (pNode->field_5).pData = pDVar5;
          Cudd_Ref((DdNode *)(pNode->field_5).pData);
          Cudd_RecursiveDeref(dd_00,pDVar4);
          Cudd_RecursiveDeref(dd_00,n);
          Abc_NodeMinimumBase(pNode);
          return 1;
        }
      }
      dd._4_4_ = dd._4_4_ + 1;
    } while( true );
  }
  __assert_fail("Abc_ObjIsNode(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                ,0x94,"int Abc_NodeRemoveDupFanins_int(Abc_Obj_t *)");
}

Assistant:

int Abc_NodeRemoveDupFanins_int( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanin1, * pFanin2;
    int i, k;
    assert( Abc_NtkIsBddLogic(pNode->pNtk) );
    assert( Abc_ObjIsNode(pNode) );
    // make sure fanins are not duplicated
    Abc_ObjForEachFanin( pNode, pFanin2, i )
    {
        Abc_ObjForEachFanin( pNode, pFanin1, k )
        {
            if ( k >= i )
                break;
            if ( pFanin1 == pFanin2 )
            {
                DdManager * dd = (DdManager *)pNode->pNtk->pManFunc;
                DdNode * bVar1 = Cudd_bddIthVar( dd, i );
                DdNode * bVar2 = Cudd_bddIthVar( dd, k );
                DdNode * bTrans, * bTemp;
                bTrans = Cudd_bddXnor( dd, bVar1, bVar2 ); Cudd_Ref( bTrans );
                pNode->pData = Cudd_bddAndAbstract( dd, bTemp = (DdNode *)pNode->pData, bTrans, bVar2 ); Cudd_Ref( (DdNode *)pNode->pData );
                Cudd_RecursiveDeref( dd, bTemp );
                Cudd_RecursiveDeref( dd, bTrans );
                Abc_NodeMinimumBase( pNode );
                return 1;
            }
        }
    }
    return 0;
}